

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall cmServer::WriteJsonObject(cmServer *this,Value *jsonValue,DebugInfo *debug)

{
  uv_rwlock_t *rwlock;
  pointer puVar1;
  uv_rwlock_t *this_00;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  pointer puVar2;
  
  rwlock = &(this->super_cmServerBase).ConnectionsMutex;
  this_00 = rwlock;
  uv_rwlock_rdlock(rwlock);
  puVar1 = (this->super_cmServerBase).Connections.
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->super_cmServerBase).Connections.
                super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    WriteJsonObject((cmServer *)&this_00->__data,
                    (puVar2->_M_t).
                    super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
                    super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
                    super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl,jsonValue,debug);
  }
  uv_rwlock_rdunlock(rwlock);
  return;
}

Assistant:

void cmServer::WriteJsonObject(const Json::Value& jsonValue,
                               const DebugInfo* debug) const
{
  uv_rwlock_rdlock(&ConnectionsMutex);
  for (auto& connection : this->Connections) {
    WriteJsonObject(connection.get(), jsonValue, debug);
  }
  uv_rwlock_rdunlock(&ConnectionsMutex);
}